

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String Bstrlib::String::Print(char *fmt,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  bstring b;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *puVar4;
  int iVar5;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  String SVar6;
  va_list arglist;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  String((String *)fmt);
  puVar4 = extraout_RDX;
  if (in_RSI != (char *)0x0) {
    b = bfromcstr("");
    if (b == (bstring)0x0) {
      operator=((String *)fmt,"<NULL>");
      puVar4 = extraout_RDX_00;
    }
    else {
      sVar3 = strlen(in_RSI);
      iVar2 = (int)sVar3 * 2;
      iVar5 = 0x10;
      if (0x10 < iVar2) {
        iVar5 = iVar2;
      }
      while (iVar2 = balloc(b,iVar5 + 2), iVar2 == 0) {
        arglist[0].reg_save_area = local_e8;
        arglist[0].overflow_arg_area = &stack0x00000008;
        arglist[0].gp_offset = 0x10;
        arglist[0].fp_offset = 0x30;
        iVar2 = vsnprintf((char *)b->data,(long)(iVar5 + 1),in_RSI,arglist);
        b->data[iVar5] = '\0';
        sVar3 = strlen((char *)b->data);
        b->slen = (int)sVar3;
        if ((int)sVar3 < iVar5) goto LAB_0010e24e;
        bVar1 = iVar5 < iVar2;
        iVar5 = iVar5 * 2;
        if (bVar1) {
          iVar5 = iVar2;
        }
      }
      b = bformat("<OUTM>");
LAB_0010e24e:
      operator=((String *)fmt,b);
      bdestroy(b);
      puVar4 = extraout_RDX_01;
    }
  }
  SVar6.super_tagbstring.data = puVar4;
  SVar6.super_tagbstring._0_8_ = fmt;
  return (String)SVar6.super_tagbstring;
}

Assistant:

String String::Print(const char * fmt, ...)
    {
        bstring b;
        va_list arglist;
        int r, n;
        String ret;

        if (fmt == NULL) return ret;
        else
        {
            if ((b = bfromcstr("")) == NULL)
            {
                ret = "<NULL>";
            }
            else
            {
                if ((n = 2*(int)strlen(fmt)) < START_VSNBUFF)
                    n = START_VSNBUFF;
                for (;;)
                {
                    if (BSTR_OK != balloc(b, n + 2))
                    {
                        b = bformat("<OUTM>");
                        break;
                    }

                    va_start(arglist, fmt);
                    exvsnprintf(r, (char *) b->data, n + 1, fmt, arglist);
                    va_end(arglist);

                    b->data[n] = '\0';
                    b->slen = (int)strlen((char *) b->data);

                    if (b->slen < n)    break;
                    if (r > n)            n = r;
                    else                 n += n;
                }
                ret = *b;
                bdestroy(b);
            }
        }
        return ret;
    }